

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

Edge __thiscall geometrycentral::surface::SurfaceMesh::getNewEdge(SurfaceMesh *this)

{
  long lVar1;
  logic_error *this_00;
  ulong uVar2;
  _List_node_base *p_Var3;
  size_type __new_size;
  Edge EVar4;
  
  if (this->useImplicitTwinFlag != true) {
    uVar2 = this->nEdgesFillCount;
    if (this->nEdgesCapacityCount <= uVar2) {
      lVar1 = this->nEdgesCapacityCount * 2;
      __new_size = lVar1 + (ulong)(lVar1 == 0);
      this->nEdgesCapacityCount = __new_size;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->eHalfedgeArr,__new_size);
      p_Var3 = (_List_node_base *)&this->edgeExpandCallbackList;
      while (p_Var3 = (((_List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                         *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var3 != (_List_node_base *)&this->edgeExpandCallbackList) {
        ::std::function<void_(unsigned_long)>::operator()
                  ((function<void_(unsigned_long)> *)(p_Var3 + 1),__new_size);
      }
      uVar2 = this->nEdgesFillCount;
    }
    this->nEdgesFillCount = uVar2 + 1;
    this->nEdgesCount = this->nEdgesCount + 1;
    this->modificationTick = this->modificationTick + 1;
    this->isCompressedFlag = false;
    EVar4.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         uVar2;
    EVar4.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
         = this;
    return (Edge)EVar4.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
    ;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error
            (this_00,"cannot construct a single new edge with implicit twin convention");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

Edge SurfaceMesh::getNewEdge() {

  if (usesImplicitTwin()) {
    throw std::logic_error("cannot construct a single new edge with implicit twin convention");
  }

  // The boring case, when no resize is needed
  if (nEdgesFillCount < nEdgesCapacityCount) {
    // No work needed
  }
  // The intesting case, where vectors resize
  else {
    size_t newEdgeCapacity = std::max(nEdgesCapacityCount * 2, (size_t)1);

    nEdgesCapacityCount = newEdgeCapacity;

    if (!usesImplicitTwin()) { // must enter this case, see test above
      eHalfedgeArr.resize(newEdgeCapacity);
    }

    // Invoke relevant callback functions
    for (auto& f : edgeExpandCallbackList) {
      f(newEdgeCapacity);
    }
  }

  nEdgesFillCount++;
  nEdgesCount++;

  modificationTick++;
  isCompressedFlag = false;
  return Edge(this, nEdgesFillCount - 1);
}